

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

int nn_shutdown(int s,int how)

{
  int iVar1;
  int *piVar2;
  nn_sock *local_20;
  nn_sock *sock;
  int rc;
  int how_local;
  int s_local;
  
  sock._4_4_ = how;
  rc = s;
  sock._0_4_ = nn_global_hold_socket(&local_20,s);
  if ((int)sock < 0) {
    iVar1 = -(int)sock;
    piVar2 = __errno_location();
    *piVar2 = iVar1;
    how_local = -1;
  }
  else {
    sock._0_4_ = nn_sock_rm_ep(local_20,sock._4_4_);
    if ((int)sock < 0) {
      nn_global_rele_socket(local_20);
      iVar1 = -(int)sock;
      piVar2 = __errno_location();
      *piVar2 = iVar1;
      how_local = -1;
    }
    else {
      if ((int)sock != 0) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/src/core/global.c"
                ,0x2a4);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_global_rele_socket(local_20);
      how_local = 0;
    }
  }
  return how_local;
}

Assistant:

int nn_shutdown (int s, int how)
{
    int rc;
    struct nn_sock *sock;

    rc = nn_global_hold_socket (&sock, s);
    if (nn_slow (rc < 0)) {
        errno = -rc;
        return -1;
    }

    rc = nn_sock_rm_ep (sock, how);
    if (nn_slow (rc < 0)) {
        nn_global_rele_socket (sock);
        errno = -rc;
        return -1;
    }
    nn_assert (rc == 0);

    nn_global_rele_socket (sock);
    return 0;
}